

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decorator.cpp
# Opt level: O0

int __thiscall Rml::Decorator::GetNumTextures(Decorator *this)

{
  bool bVar1;
  size_type sVar2;
  int result;
  Decorator *this_local;
  
  bVar1 = Texture::operator_cast_to_bool(&this->first_texture);
  sVar2 = ::std::vector<Rml::Texture,_std::allocator<Rml::Texture>_>::size
                    (&this->additional_textures);
  return (int)sVar2 + (uint)bVar1;
}

Assistant:

int Decorator::GetNumTextures() const
{
	int result = (first_texture ? 1 : 0);
	result += (int)additional_textures.size();
	return result;
}